

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

string * __thiscall
SSTableCache::get_abi_cxx11_(string *__return_storage_ptr__,SSTableCache *this,uint64_t key)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  runtime_error *this_00;
  difference_type __d;
  ulong uVar6;
  pointer ppVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream in;
  byte abStack_218 [488];
  
  if ((((this->header).minKey <= key) && (key <= (this->header).maxKey)) &&
     (bVar3 = BloomFilter::exists(&this->bloomFilter,key), bVar3)) {
    ppVar7 = (this->index).
             super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(this->index).
                  super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + (-0x10 - (long)ppVar7) >> 4;
    while (uVar4 = uVar6, 0 < (long)uVar4) {
      uVar6 = uVar4 >> 1;
      if (ppVar7[uVar6].first < key) {
        ppVar7 = ppVar7 + uVar6 + 1;
        uVar6 = ~uVar6 + uVar4;
      }
    }
    if (ppVar7->first == key) {
      std::ifstream::ifstream(&in,(string *)&this->fileName,_S_in|_S_bin);
      if ((abStack_218[*(long *)(_in + -0x18)] & 5) == 0) {
        iVar1 = ppVar7->second;
        iVar2 = ppVar7[1].second;
        std::istream::seekg((long)&in,iVar1 + (int)(this->header).length * 0xc + 0x282c);
        lVar8 = (long)iVar2 - (long)iVar1;
        pcVar5 = (char *)operator_new__(lVar8 + 1);
        std::istream::read((char *)&in,(long)pcVar5);
        pcVar5[lVar8] = '\0';
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,pcVar5,(allocator *)&bStack_278);
        operator_delete__(pcVar5);
        std::ifstream::close();
        std::ifstream::~ifstream(&in);
        return __return_storage_ptr__;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_258,"readDic: Open file ",&this->fileName);
      std::operator+(&bStack_278,&local_258," failed!");
      std::runtime_error::runtime_error(this_00,(string *)&bStack_278);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&in);
  return __return_storage_ptr__;
}

Assistant:

string SSTableCache::get(uint64_t key) const {
  if (!(header.minKey <= key && key <= header.maxKey)) return "";
  if (!bloomFilter.exists(key)) return "";
  auto cmp = [](SSTableIndex left, uint64_t key) { return left.first < key; };
  auto low = lower_bound(index.begin(), index.end() - 1, key, cmp);
  if (low->first != key) return "";

  ifstream in(fileName, ios_base::in | ios_base::binary);
  if (in.fail())
    throw runtime_error("readDic: Open file " + fileName + " failed!");

  auto offset = low->second;
  low++;
  int valueSize;
  valueSize = low->second - offset;

  in.seekg(10272 + (header.length + 1) * 12 + offset, ifstream::beg);

  char *buf = new char[valueSize + 1];
  in.read(buf, valueSize);
  buf[valueSize] = '\0';
  string value(buf);
  delete[] buf;

  in.close();
  return value;
}